

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,uint64_t *pixelDataSize)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ArgExc *pAVar5;
  ulong uVar6;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  undefined1 local_1e0 [8];
  undefined4 local_1d8;
  long local_1c0;
  undefined8 local_1b8;
  long local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar2 = exr_read_scanline_chunk_info
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     ((this->_data).
                      super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->partNumber,firstScanLine,local_1e0);
  if (iVar2 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"Error reading deep pixel data from image file \"",0x2f);
    pcVar3 = Context::fileName(&this->_ctxt);
    poVar4 = std::operator<<(local_190,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\". Unable to query data block information.",0x2a);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_1a0);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  uVar6 = local_1a8 + local_1c0 + 0x1c;
  uVar1 = *pixelDataSize;
  *pixelDataSize = uVar6;
  if ((pixelData != (char *)0x0) && (uVar6 <= uVar1)) {
    *(undefined4 *)pixelData = local_1d8;
    *(long *)(pixelData + 4) = local_1a8;
    *(long *)(pixelData + 0xc) = local_1c0;
    *(undefined8 *)(pixelData + 0x14) = local_1b8;
    iVar2 = exr_read_deep_chunk(*(this->_ctxt)._ctxt.
                                 super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,((this->_data).
                                          super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->partNumber,local_1e0,pixelData + local_1a8 + 0x1c
                                ,pixelData + 0x1c);
    if (iVar2 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"Error reading deep pixel data from image file \"",0x2f);
      pcVar3 = Context::fileName(&this->_ctxt);
      poVar4 = std::operator<<(local_190,pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\". Unable to read raw pixel data of ",0x24);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes.",7);
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar5,local_1a0);
      __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  return;
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (
    int firstScanLine, char* pixelData, uint64_t& pixelDataSize)
{
    exr_chunk_info_t cinfo;

    static_assert (sizeof(DeepChunkHeader) == 28, "Expect a 28-byte chunk header");

    // api is kind of different than the normal scanline raw pixel data
    // in that it also includes the chunk header block, so the full chunk

    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
            _ctxt, _data->partNumber, firstScanLine, &cinfo))
    {
        uint64_t cbytes;
        cbytes = sizeof (DeepChunkHeader);
        cbytes += cinfo.sample_count_table_size;
        cbytes += cinfo.packed_size;

        if (!pixelData || cbytes > pixelDataSize)
        {
            pixelDataSize = cbytes;
            return;
        }

        pixelDataSize = cbytes;

        DeepChunkHeader* dch = reinterpret_cast<DeepChunkHeader*> (pixelData);
        dch->scanline = cinfo.start_y;
        dch->packedCountSize = cinfo.sample_count_table_size;
        dch->packedDataSize = cinfo.packed_size;
        dch->unpackedDataSize = cinfo.unpacked_size;

        pixelData += sizeof(DeepChunkHeader);
        if (EXR_ERR_SUCCESS !=
            exr_read_deep_chunk (
                _ctxt,
                _data->partNumber,
                &cinfo,
                pixelData + cinfo.sample_count_table_size,
                pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading deep pixel data from image "
                "file \""
                << fileName () << "\". Unable to read raw pixel data of "
                << pixelDataSize << " bytes.");
        }
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error reading deep pixel data from image "
            "file \""
            << fileName ()
            << "\". Unable to query data block information.");
    }
}